

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

void h2o_cache_delete(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash)

{
  khint_t kVar1;
  uint uVar2;
  kh_cache_t *pkVar3;
  khint32_t *pkVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  byte bVar8;
  size_t __n;
  int iVar9;
  uint uVar10;
  uint iter;
  
  __n = key.len;
  if (keyhash == 0) {
    keyhash = 0;
    for (sVar7 = __n; sVar7 != 0; sVar7 = sVar7 - 1) {
      keyhash = (uint)(byte)key.base[sVar7 - 1] + keyhash * 0x1f;
    }
  }
  if ((cache->flags & 1) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)&cache->mutex);
  }
  purge(cache,now);
  pkVar3 = cache->table;
  kVar1 = pkVar3->n_buckets;
  if (kVar1 == 0) {
    iter = 0;
LAB_00128058:
    if (iter != kVar1) {
      erase_ref(cache,iter,0);
    }
  }
  else {
    uVar10 = keyhash & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar9 = 1;
    iter = uVar10;
    do {
      uVar2 = pkVar4[iter >> 4];
      bVar8 = (char)iter * '\x02' & 0x1e;
      uVar5 = uVar2 >> bVar8;
      if (((uVar5 & 2) != 0) ||
         ((((uVar5 & 1) == 0 && ((pkVar3->keys[iter]->key).len == __n)) &&
          (iVar6 = bcmp((pkVar3->keys[iter]->key).base,key.base,__n), iVar6 == 0)))) {
        if ((uVar2 >> bVar8 & 3) != 0) {
          iter = kVar1;
        }
        goto LAB_00128058;
      }
      iter = iter + iVar9 & kVar1 - 1;
      iVar9 = iVar9 + 1;
    } while (iter != uVar10);
  }
  if ((cache->flags & 1) == 0) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cache->mutex);
  return;
}

Assistant:

void h2o_cache_delete(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash)
{
    h2o_cache_ref_t search_key;
    khiter_t iter;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);
    search_key.key = key;
    search_key.keyhash = keyhash;

    lock_cache(cache);

    purge(cache, now);

    if ((iter = kh_get(cache, cache->table, &search_key)) != kh_end(cache->table))
        erase_ref(cache, iter, 0);

    unlock_cache(cache);
}